

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::SharedLibraryShellCommand::executeExternalCommand
          (SharedLibraryShellCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  code *pcVar1;
  ProcessAttributes attributes;
  byte bVar2;
  StringRef *pSVar3;
  undefined8 unaff_RBX;
  long lVar4;
  ArrayRef<llvm::StringRef> commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *local_d8;
  undefined8 uStack_d0;
  byte local_c8;
  TaskInterface local_b8;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  StringRef *local_88;
  long lStack_80;
  long local_78;
  undefined1 local_70 [24];
  code *local_58;
  bool local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b8.ctx = ti.ctx;
  local_b8.impl = ti.impl;
  (anonymous_namespace)::SharedLibraryShellCommand::getArgs_abi_cxx11_(&local_48,this);
  local_88 = (StringRef *)0x0;
  lStack_80 = 0;
  local_78 = 0;
  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_88,
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pSVar3 = local_88;
  lVar4 = lStack_80 - (long)local_88;
  local_a8 = 1;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0x101;
  local_c8 = (completionFn->Storage).hasVal;
  if ((bool)local_c8 == true) {
    local_d8 = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    pcVar1 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                       0x10);
    if (pcVar1 == (code *)0x0) {
      completionFn = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0;
      unaff_RBX = 0;
    }
    else {
      (*pcVar1)(&local_e8,completionFn,2);
      unaff_RBX = *(undefined8 *)
                   ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18)
      ;
      completionFn = *(Optional<std::function<void_(llbuild::basic::ProcessResult)>_> **)
                      ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                      0x10);
      local_d8 = completionFn;
      uStack_d0 = unaff_RBX;
    }
  }
  bVar2 = local_c8;
  local_70._0_8_ = operator_new(0x28);
  *(byte *)(local_70._0_8_ + 0x20) = bVar2;
  if ((bVar2 & 1) != 0) {
    *(undefined8 *)local_70._0_8_ = 0;
    *(undefined8 *)(local_70._0_8_ + 8) = 0;
    *(undefined8 *)(local_70._0_8_ + 0x10) = 0;
    *(undefined8 *)(local_70._0_8_ + 0x18) = unaff_RBX;
    if (completionFn != (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0) {
      *(undefined8 *)local_70._0_8_ = local_e8;
      *(undefined8 *)(local_70._0_8_ + 8) = uStack_e0;
      *(Optional<std::function<void_(llbuild::basic::ProcessResult)>_> **)(local_70._0_8_ + 0x10) =
           completionFn;
      local_d8 = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0;
      uStack_d0 = 0;
    }
  }
  local_50 = true;
  local_58 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
             ::_M_invoke;
  local_70[8] = '\0';
  local_70[9] = '\0';
  local_70[10] = '\0';
  local_70[0xb] = '\0';
  local_70[0xc] = '\0';
  local_70[0xd] = '\0';
  local_70[0xe] = '\0';
  local_70[0xf] = '\0';
  local_70._16_8_ =
       std::
       _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
       ::_M_manager;
  attributes._2_6_ = uStack_a6;
  attributes.canSafelyInterrupt = (bool)(undefined1)local_a8;
  attributes.connectToConsole = (bool)local_a8._1_1_;
  attributes._26_6_ = uStack_8e;
  attributes.inheritEnvironment = (bool)(undefined1)uStack_90;
  attributes.controlEnabled = (bool)uStack_90._1_1_;
  attributes.workingDir.Data = (char *)uStack_a0;
  attributes.workingDir.Length = uStack_98;
  commandLine.Length = lVar4 >> 4;
  commandLine.Data = pSVar3;
  llbuild::core::TaskInterface::spawn
            (&local_b8,context,commandLine,
             (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
             (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_70,
             (ProcessDelegate *)0x0);
  if (local_50 == true) {
    if ((code *)local_70._16_8_ != (code *)0x0) {
      (*(code *)local_70._16_8_)(local_70,local_70,3);
    }
    local_50 = false;
  }
  if (((local_c8 & 1) != 0) &&
     (local_d8 != (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0)) {
    (*(code *)local_d8)(&local_e8,&local_e8,3);
  }
  if (local_88 != (StringRef *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&, TaskInterface ti, QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {

    auto args = getArgs();
    ti.spawn(
        context, std::vector<StringRef>(args.begin(), args.end()), {},
        {true}, {[completionFn](ProcessResult result) {
          if (completionFn.hasValue())
            completionFn.getValue()(result);
        }});
  }